

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O0

void applyMeantoneTemperament(MidiFile *midifile,int base)

{
  int iVar1;
  MidiEventList *pMVar2;
  int local_11c;
  int local_10c;
  int local_fc;
  int local_ec;
  int local_dc;
  int local_cc;
  int local_bc;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_7c;
  int local_70;
  undefined1 local_58 [4];
  int chan;
  MidiEvent event;
  int track;
  int tracks;
  int base_local;
  MidiFile *midifile_local;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  event.m_eventlink._4_4_ = (uint)(iVar1 != 1);
  smf::MidiEvent::MidiEvent((MidiEvent *)local_58);
  event.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  local_70 = base;
  if (8 < base) {
    local_70 = base + 1;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_70,0,0x40);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_7c = base + 1;
  if (8 < local_7c) {
    local_7c = base + 2;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_7c,0x29,0x38);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_8c = base + 2;
  if (8 < local_8c) {
    local_8c = base + 3;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_8c,0x69,0x3d);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_9c = base + 3;
  if (8 < local_9c) {
    local_9c = base + 4;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_9c,0x26,0x43);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_ac = base + 4;
  if (8 < local_ac) {
    local_ac = base + 5;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_ac,0x4f,0x3b);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_bc = base + 5;
  if (8 < local_bc) {
    local_bc = base + 6;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_bc,0xb,0x41);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_cc = base + 6;
  if (8 < local_cc) {
    local_cc = base + 7;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_cc,0x38,0x39);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_dc = base + 7;
  if (8 < local_dc) {
    local_dc = base + 8;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_dc,0x75,0x3e);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_ec = base + 8;
  if (8 < local_ec) {
    local_ec = base + 9;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_ec,0x1e,0x37);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_fc = base + 9;
  if (8 < local_fc) {
    local_fc = base + 10;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_fc,0x5a,0x3c);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_10c = base + 10;
  if (8 < local_10c) {
    local_10c = base + 0xb;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_10c,0x17,0x42);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  local_11c = base + 0xb;
  if (8 < local_11c) {
    local_11c = base + 0xc;
  }
  smf::MidiMessage::makePitchBend((MidiMessage *)local_58,local_11c,0x44,0x3a);
  pMVar2 = smf::MidiFile::operator[](midifile,event.m_eventlink._4_4_);
  smf::MidiEventList::append(pMVar2,(MidiEvent *)local_58);
  smf::MidiEvent::~MidiEvent((MidiEvent *)local_58);
  return;
}

Assistant:

void applyMeantoneTemperament(MidiFile& midifile, int base) {
	int tracks = midifile.getTrackCount();
	int track = (tracks == 1) ? 0 : 1;
	MidiEvent event;
	event.tick = 0;
	int chan;

	chan = 0 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 0, 64);
	midifile[track].append(event); // C:    0   cents from equal temperament

	chan = 1 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 41, 56);
	midifile[track].append(event); // C#: -24.0 cents from equal temperament

	chan = 2 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 105, 61);
	midifile[track].append(event); // D:   -6.8 cents from equal temperament

	chan = 3 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 38, 67);
	midifile[track].append(event); // Ef: +10.3 cents from equal temperament

	chan = 4 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 79, 59);
	midifile[track].append(event); // E:  -13.7 cents from equal temperament

	chan = 5 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 11, 65);
	midifile[track].append(event); // F:   +3.4 cents from equal temperament

	chan = 6 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 56, 57);
	midifile[track].append(event); // F#: -20.5 cents from equal temperament

	chan = 7 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 117, 62);
	midifile[track].append(event); // G:   -3.4 cents from equal temperament

	chan = 8 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 30, 55);
	midifile[track].append(event); // Af: -27.4 cents from equal temperament

	chan = 9 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 90, 60);
	midifile[track].append(event); // A:  -10.3 cents from equal temperament

	chan = 10 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 23, 66);
	midifile[track].append(event); // Bf:  +6.8 cents from equal temperament

	chan = 11 + base;
	chan = (chan < 0x09) ? chan : chan+1;
	event.makePitchBend(chan, 68, 58);
	midifile[track].append(event); // B:  -17.1 cents from equal temperament
}